

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queens-seq.c
# Opt level: O3

int main(int argc,char **argv)

{
  long lVar1;
  __syscall_slong_t _Var2;
  uint n;
  long lVar3;
  undefined8 uStack_40;
  undefined1 local_38 [8];
  timespec tv;
  
  if (argc != 1) {
    uStack_40 = 0x10132b;
    n = atoi(argv[1]);
    lVar1 = -((long)(int)n + 0xfU & 0xfffffffffffffff0);
    *(undefined8 *)((long)&uStack_40 + lVar1) = 0x10134f;
    printf("running queens %d sequentially...\n",(ulong)n);
    *(undefined8 *)((long)&uStack_40 + lVar1) = 0x101360;
    clock_gettime(1,(timespec *)local_38);
    tv.tv_nsec = (__syscall_slong_t)((double)tv.tv_sec * 1e-09 + (double)(long)local_38);
    *(undefined8 *)((long)&uStack_40 + lVar1) = 0x101388;
    lVar3 = nqueens(n,0,local_38 + lVar1);
    *(undefined8 *)((long)&uStack_40 + lVar1) = 0x101398;
    clock_gettime(1,(timespec *)local_38);
    tv.tv_nsec = (__syscall_slong_t)
                 (((double)tv.tv_sec * 1e-09 + (double)(long)local_38) - (double)tv.tv_nsec);
    *(undefined8 *)((long)&uStack_40 + lVar1) = 0x1013d2;
    printf("Result: Q(%d) = %ld\n",(ulong)n,lVar3);
    _Var2 = tv.tv_nsec;
    *(undefined8 *)((long)&uStack_40 + lVar1) = 0x1013e5;
    printf("Time: %f\n",_Var2);
    return 0;
  }
  uStack_40 = 0x1013fa;
  main_cold_1();
  halt_baddata();
}

Assistant:

int main(int argc, char *argv[])
{
    if (1 == argc) {
        usage(argv[0]);
        exit(1);
    }

    int n = atoi(argv[1]);

    char *a = (char*)alloca(n*sizeof(char));

    printf("running queens %d sequentially...\n", n);

    double t1 = wctime();
    long res = nqueens(n, 0, a);
    double t2 = wctime();

    printf("Result: Q(%d) = %ld\n", n, res);

    printf("Time: %f\n", t2-t1);

    return 0;
}